

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::RenderLineStrip<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>
          (ImPlot *this,GetterFuncPtr *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
          float line_weight,ImU32 col)

{
  float *pfVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  double dVar4;
  double dVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double in_XMM1_Qa;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  GetterFuncPtr *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  double dVar12;
  
  pIVar6 = GImPlot;
  local_60 = (ImDrawList *)transformer;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_48 = *(int *)(this + 0x10) + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    local_58 = (undefined1  [8])this;
    local_50 = getter;
    local_44 = (ImU32)DrawList;
    local_40 = line_weight;
    dVar4 = (double)(**(code **)this)(*(undefined8 *)(this + 8),0);
    pIVar7 = GImPlot;
    dVar5 = log10(dVar4 / (GImPlot->CurrentPlot->XAxis).Range.Min);
    pIVar3 = pIVar7->CurrentPlot;
    dVar4 = (pIVar3->XAxis).Range.Min;
    iVar8 = *(int *)&getter->Getter;
    local_3c.y = (float)((in_XMM1_Qa - pIVar3->YAxis[iVar8].Range.Min) * pIVar7->My[iVar8] +
                        (double)pIVar7->PixelRange[iVar8].Min.y);
    local_3c.x = (float)((((double)(float)(dVar5 / pIVar7->LogDenX) *
                           ((pIVar3->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar7->Mx +
                        (double)pIVar7->PixelRange[iVar8].Min.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin> *)local_58,
               local_60,&pIVar6->CurrentPlot->PlotRect);
  }
  else {
    dVar4 = (double)(**(code **)this)(*(undefined8 *)(this + 8),0);
    pIVar7 = GImPlot;
    dVar5 = log10(dVar4 / (GImPlot->CurrentPlot->XAxis).Range.Min);
    pIVar3 = pIVar7->CurrentPlot;
    dVar4 = (pIVar3->XAxis).Range.Min;
    iVar8 = *(int *)&getter->Getter;
    fVar10 = (float)((in_XMM1_Qa - pIVar3->YAxis[iVar8].Range.Min) * pIVar7->My[iVar8] +
                    (double)pIVar7->PixelRange[iVar8].Min.y);
    dVar12 = (double)(ulong)(uint)fVar10;
    local_58._4_4_ = fVar10;
    local_58._0_4_ =
         (float)((((double)(float)(dVar5 / pIVar7->LogDenX) * ((pIVar3->XAxis).Range.Max - dVar4) +
                  dVar4) - dVar4) * pIVar7->Mx + (double)pIVar7->PixelRange[iVar8].Min.x);
    if (1 < *(int *)(this + 0x10)) {
      iVar8 = 1;
      do {
        dVar4 = (double)(**(code **)this)(*(undefined8 *)(this + 8),iVar8);
        pIVar7 = GImPlot;
        dVar5 = log10(dVar4 / (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar3 = pIVar7->CurrentPlot;
        dVar4 = (pIVar3->XAxis).Range.Min;
        iVar2 = *(int *)&getter->Getter;
        fVar9 = (float)((((double)(float)(dVar5 / pIVar7->LogDenX) *
                          ((pIVar3->XAxis).Range.Max - dVar4) + dVar4) - dVar4) * pIVar7->Mx +
                       (double)pIVar7->PixelRange[iVar2].Min.x);
        fVar11 = (float)((dVar12 - pIVar3->YAxis[iVar2].Range.Min) * pIVar7->My[iVar2] +
                        (double)pIVar7->PixelRange[iVar2].Min.y);
        local_68.y = fVar11;
        local_68.x = fVar9;
        pIVar3 = pIVar6->CurrentPlot;
        dVar12 = (double)(ulong)(uint)fVar11;
        fVar10 = (float)local_58._4_4_;
        if (fVar11 <= (float)local_58._4_4_) {
          fVar10 = fVar11;
        }
        if ((fVar10 < (pIVar3->PlotRect).Max.y) &&
           (fVar10 = (float)(~-(uint)(fVar11 <= (float)local_58._4_4_) & (uint)fVar11 |
                            local_58._4_4_ & -(uint)(fVar11 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar3->PlotRect).Min.y, *pfVar1 <= fVar10 && fVar10 != *pfVar1)) {
          dVar12 = (double)(ulong)(uint)fVar9;
          fVar10 = (float)local_58._0_4_;
          if (fVar9 <= (float)local_58._0_4_) {
            fVar10 = fVar9;
          }
          if ((fVar10 < (pIVar3->PlotRect).Max.x) &&
             (fVar10 = (float)(~-(uint)(fVar9 <= (float)local_58._0_4_) & (uint)fVar9 |
                              local_58._0_4_ & -(uint)(fVar9 <= (float)local_58._0_4_)),
             (pIVar3->PlotRect).Min.x <= fVar10 && fVar10 != (pIVar3->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,(ImU32)DrawList,line_weight);
          }
        }
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
        iVar8 = iVar8 + 1;
      } while (iVar8 < *(int *)(this + 0x10));
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}